

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UResourceBundle *
ures_findSubResource_63(UResourceBundle *resB,char *path,UResourceBundle *fillIn,UErrorCode *status)

{
  Resource r;
  UResourceBundle *pUVar1;
  char *path_local;
  char *key;
  
  pUVar1 = fillIn;
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    path_local = path;
    do {
      r = res_findResource_63(&resB->fResData,resB->fRes,&path_local,&key);
      if (r == 0xffffffff) {
        *status = U_MISSING_RESOURCE_ERROR;
        return pUVar1;
      }
      pUVar1 = init_resb_result(&resB->fResData,r,key,-1,resB->fData,resB,0,fillIn,status);
      resB = pUVar1;
    } while (*path_local != '\0');
  }
  return pUVar1;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2
ures_findSubResource(const UResourceBundle *resB, char* path, UResourceBundle *fillIn, UErrorCode *status) 
{
  Resource res = RES_BOGUS;
  UResourceBundle *result = fillIn;
  const char *key;

  if(status == NULL || U_FAILURE(*status)) {
    return result;
  }

  /* here we do looping and circular alias checking */
  /* this loop is here because aliasing is resolved on this level, not on res level */
  /* so, when we encounter an alias, it is not an aggregate resource, so we return */
  do {
    res = res_findResource(&(resB->fResData), resB->fRes, &path, &key); 
    if(res != RES_BOGUS) {
        result = init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        resB = result;
    } else {
        *status = U_MISSING_RESOURCE_ERROR;
        break;
    }
  } while(*path); /* there is more stuff in the path */

  return result;
}